

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ByteData *binary_data)

{
  bool bVar1;
  size_t sVar2;
  ByteData *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint32_t size;
  ByteData *binary_data_local;
  ScriptElement *this_local;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_009f6e58;
  this->type_ = kElementBinary;
  ScriptOperator::ScriptOperator(&this->op_code_,kOpInvalidOpCode);
  ByteData::ByteData((ByteData *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  this->value_ = 0;
  sVar2 = ByteData::GetDataSize(binary_data);
  if ((((uint)sVar2 != 0) && ((uint)sVar2 < 6)) &&
     (bVar1 = ConvertBinaryToNumber(this,&this->value_), bVar1)) {
    this->type_ = kElementNumber;
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(const ByteData& binary_data)
    : type_(kElementBinary),
      op_code_(kOpInvalidOpCode),
      binary_data_(binary_data),
      value_(0) {
  // check number
  uint32_t size = static_cast<uint32_t>(binary_data.GetDataSize());
  if ((size > 0) && (size <= 5) && ConvertBinaryToNumber(&value_)) {
    type_ = kElementNumber;
  }
}